

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_file.cpp
# Opt level: O3

request_ptr __thiscall
foxxll::linuxaio_file::awrite
          (linuxaio_file *this,void *buffer,offset_type offset,size_type bytes,
          completion_handler *on_complete)

{
  instance_pointer this_00;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> *in_R9;
  read_or_write local_44;
  linuxaio_file *local_40;
  _func_int **local_38;
  completion_handler *local_30;
  size_type local_28;
  void *local_20;
  
  local_44 = WRITE;
  local_40 = (linuxaio_file *)buffer;
  local_30 = on_complete;
  local_28 = bytes;
  local_20 = (void *)offset;
  tlx::
  make_counting<foxxll::linuxaio_request,tlx::Delegate<void(foxxll::request*,bool),std::allocator<void>>const&,foxxll::linuxaio_file*,void*&,unsigned_long&,unsigned_long&,foxxll::request_interface::read_or_write>
            ((tlx *)&local_38,in_R9,&local_40,&local_20,&local_28,(unsigned_long *)&local_30,
             &local_44);
  (this->super_ufs_file_base)._vptr_ufs_file_base = local_38;
  local_38 = (_func_int **)0x0;
  tlx::CountingPtr<foxxll::linuxaio_request,_tlx::CountingPtrDefaultDeleter>::dec_reference
            ((CountingPtr<foxxll::linuxaio_request,_tlx::CountingPtrDefaultDeleter> *)&local_38);
  this_00 = singleton<foxxll::disk_queues,true>::instance_;
  if (singleton<foxxll::disk_queues,true>::instance_ == (disk_queues *)0x0) {
    this_00 = singleton<foxxll::disk_queues,_true>::create_instance<foxxll::disk_queues>();
  }
  disk_queues::add_request(this_00,(request_ptr *)this,(long)*(int *)((long)buffer + 0x68));
  return (request_ptr)(request *)this;
}

Assistant:

request_ptr linuxaio_file::awrite(
    void* buffer, offset_type offset, size_type bytes,
    const completion_handler& on_complete)
{
    request_ptr req = tlx::make_counting<linuxaio_request>(
            on_complete, this, buffer, offset, bytes, request::WRITE
        );

    disk_queues::get_instance()->add_request(req, get_queue_id());

    return req;
}